

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageHolder::extractMessage(MessageHolder *this,int index)

{
  pointer puVar1;
  MessageHolder *pMVar2;
  uint in_EDX;
  undefined4 in_register_00000034;
  long *plVar3;
  uint local_1c;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,index);
  pMVar2 = this;
  if (((-1 < (int)in_EDX) && ((int)in_EDX < (int)((ulong)(plVar3[1] - *plVar3) >> 3))) &&
     (*(long *)(*plVar3 + (ulong)in_EDX * 8) != 0)) {
    local_1c = in_EDX;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)(plVar3 + 3),(value_type_conflict1 *)&local_1c);
    pMVar2 = (MessageHolder *)(*plVar3 + (long)(int)local_1c * 8);
    (pMVar2->messages).
    super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x1f]._M_t.
    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> =
         (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)0x0;
    puVar1 = (pMVar2->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined2 *)
     ((long)&puVar1[1]._M_t.
             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> + 2) = 0;
    (this->messages).
    super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar1;
  }
  (pMVar2->messages).
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageHolder::extractMessage(int index)
{
    if (isValidIndex(index, messages)) {
        if (messages[index]) {
            freeMessageSlots.push_back(index);
            messages[index]->backReference = nullptr;
            messages[index]->messageValidation = 0;
            return std::move(messages[index]);
        }
    }
    return nullptr;
}